

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O1

pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
* __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::insert(pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
         *__return_storage_ptr__,
        small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
        *this,value_type *x)

{
  size_t *psVar1;
  unsigned_long *puVar2;
  uint uVar3;
  int iVar4;
  unsigned_long uVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
  *paVar9;
  bool bVar10;
  ulong uVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool>
  pVar12;
  
  uVar3 = this->size_;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
LAB_00125eae:
    pVar12 = std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
             ::_M_insert_unique<std::pair<unsigned_long_const,ctemplate::TemplateString>const&>
                       ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
                         *)&(this->field_2).dummy_,x);
    bVar10 = pVar12.second;
    (__return_storage_ptr__->first).array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
    (__return_storage_ptr__->first).hash_iter_._M_node = pVar12.first._M_node._M_node;
  }
  else {
    if (uVar8 != 0) {
      paVar9 = &this->field_2;
      uVar11 = uVar8;
      do {
        if (*(unsigned_long *)paVar9 == x->first) {
          (__return_storage_ptr__->first).array_iter_ =
               (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
               paVar9;
          (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
          bVar10 = false;
          goto LAB_00125f1a;
        }
        paVar9 = (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
                  *)((long)paVar9 + 0x28);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      if (uVar3 == 4) {
        ConvertToRealMap(this);
        goto LAB_00125eae;
      }
    }
    *(TemplateId *)((long)&this->field_2 + uVar8 * 0x28 + 0x20) = (x->second).id_;
    uVar5 = x->first;
    pcVar6 = (x->second).ptr_;
    sVar7 = *(size_t *)&(x->second).is_immutable_;
    psVar1 = (size_t *)((long)&this->field_2 + uVar8 * 0x28 + 0x10);
    *psVar1 = (x->second).length_;
    psVar1[1] = sVar7;
    puVar2 = (unsigned_long *)((long)&this->field_2 + uVar8 * 0x28);
    *puVar2 = uVar5;
    puVar2[1] = (unsigned_long)pcVar6;
    iVar4 = this->size_;
    this->size_ = iVar4 + 1;
    (__return_storage_ptr__->first).array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
         ((long)&this->field_2 + (long)iVar4 * 0x28);
    (__return_storage_ptr__->first).hash_iter_._M_node = (_Base_ptr)0x0;
    bVar10 = true;
  }
LAB_00125f1a:
  __return_storage_ptr__->second = bVar10;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& x) {
    key_equal compare;

    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, x.first)) {
          return std::make_pair(iterator(array_ + i), false);
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();  // Invalidates all iterators!
        std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
        return std::make_pair(iterator(ret.first), ret.second);
      } else {
        array_[size_].Init(x);
        return std::make_pair(iterator(array_ + size_++), true);
      }
    } else {
      std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
      return std::make_pair(iterator(ret.first), ret.second);
    }
  }